

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall APlayerPawn::ActivateMorphWeapon(APlayerPawn *this)

{
  PClass *p;
  PClassActor *type;
  DPSprite *pDVar1;
  AWeapon *this_00;
  FState *state;
  PClassActor *pPVar2;
  player_t *ppVar3;
  FName local_24;
  
  p = PClass::FindClass(&local_24);
  type = dyn_cast<PClassActor>((DObject *)p);
  ppVar3 = (this->super_AActor).player;
  ppVar3->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  if (ppVar3->ReadyWeapon != (AWeapon *)0x0) {
    pDVar1 = player_t::GetPSprite(ppVar3,PSP_WEAPON);
    pDVar1->y = 32.0;
  }
  if (type == (PClassActor *)0x0) {
LAB_00468605:
    ppVar3 = (this->super_AActor).player;
    ppVar3->ReadyWeapon = (AWeapon *)0x0;
  }
  else {
    pPVar2 = type;
    if (type != (PClassActor *)AWeapon::RegistrationInfo.MyClass) {
      do {
        pPVar2 = (PClassActor *)(pPVar2->super_PClass).ParentClass;
        if (pPVar2 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
      } while (pPVar2 != (PClassActor *)0x0);
      if (pPVar2 == (PClassActor *)0x0) goto LAB_00468605;
    }
    this_00 = (AWeapon *)
              AActor::FindInventory(&((this->super_AActor).player)->mo->super_AActor,type,false);
    ppVar3 = (this->super_AActor).player;
    ppVar3->ReadyWeapon = this_00;
    if (this_00 == (AWeapon *)0x0) {
      this_00 = (AWeapon *)AActor::GiveInventoryType(&ppVar3->mo->super_AActor,type);
      ppVar3 = (this->super_AActor).player;
      ppVar3->ReadyWeapon = this_00;
      if (this_00 == (AWeapon *)0x0) goto LAB_00468617;
      this_00->GivenAsMorphWeapon = true;
    }
    state = AWeapon::GetReadyState(this_00);
    P_SetPsprite(ppVar3,PSP_WEAPON,state,false);
    ppVar3 = (this->super_AActor).player;
    if (ppVar3->ReadyWeapon != (AWeapon *)0x0) {
      P_SetPsprite(ppVar3,PSP_FLASH,(FState *)0x0,false);
      ppVar3 = (this->super_AActor).player;
    }
  }
LAB_00468617:
  ppVar3->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  return;
}

Assistant:

void APlayerPawn::ActivateMorphWeapon ()
{
	PClassActor *morphweapon = PClass::FindActor (MorphWeapon);
	player->PendingWeapon = WP_NOCHANGE;

	if (player->ReadyWeapon != nullptr)
	{
		player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
	}

	if (morphweapon == nullptr || !morphweapon->IsDescendantOf (RUNTIME_CLASS(AWeapon)))
	{ // No weapon at all while morphed!
		player->ReadyWeapon = nullptr;
	}
	else
	{
		player->ReadyWeapon = static_cast<AWeapon *>(player->mo->FindInventory (morphweapon));
		if (player->ReadyWeapon == nullptr)
		{
			player->ReadyWeapon = static_cast<AWeapon *>(player->mo->GiveInventoryType (morphweapon));
			if (player->ReadyWeapon != nullptr)
			{
				player->ReadyWeapon->GivenAsMorphWeapon = true; // flag is used only by new beastweap semantics in P_UndoPlayerMorph
			}
		}
		if (player->ReadyWeapon != nullptr)
		{
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
	}

	if (player->ReadyWeapon != nullptr)
	{
		P_SetPsprite(player, PSP_FLASH, nullptr);
	}

	player->PendingWeapon = WP_NOCHANGE;
}